

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

__ssize_t __thiscall
httplib::detail::stream_line_reader::getline
          (stream_line_reader *this,char **__lineptr,size_t *__n,FILE *__stream)

{
  int iVar1;
  int extraout_var;
  ssize_t n;
  long lStack_20;
  char byte;
  size_t i;
  stream_line_reader *this_local;
  ulong uVar2;
  
  this->fixed_buffer_used_size_ = 0;
  i = (size_t)this;
  std::__cxx11::string::clear();
  lStack_20 = 0;
  do {
    iVar1 = (*this->strm_->_vptr_Stream[4])(this->strm_,(long)&n + 7,1);
    uVar2 = CONCAT44(extraout_var,iVar1);
    if (extraout_var < 0) {
      this_local._7_1_ = 0;
LAB_0012be38:
      return CONCAT71((int7)(uVar2 >> 8),this_local._7_1_);
    }
    if (uVar2 == 0) {
      if (lStack_20 == 0) {
        this_local._7_1_ = 0;
      }
      else {
LAB_0012be34:
        this_local._7_1_ = 1;
      }
      goto LAB_0012be38;
    }
    append(this,n._7_1_);
    uVar2 = (ulong)(uint)(int)n._7_1_;
    if ((int)n._7_1_ == 10) goto LAB_0012be34;
    lStack_20 = lStack_20 + 1;
  } while( true );
}

Assistant:

bool getline() {
				fixed_buffer_used_size_ = 0;
				glowable_buffer_.clear();

				for (size_t i = 0;; i++) {
					char byte;
					auto n = strm_.read(&byte, 1);

					if (n < 0) {
						return false;
					} else if (n == 0) {
						if (i == 0) {
							return false;
						} else {
							break;
						}
					}

					append(byte);

					if (byte == '\n') { break; }
				}

				return true;
			}